

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O0

void __thiscall
slang::ast::Scope::addWildcardImport
          (Scope *this,PackageImportItemSyntax *item,
          span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
          attributes)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax;
  bool bVar1;
  reference ppWVar2;
  SourceLocation SVar3;
  WildcardImportSymbol *pWVar4;
  Scope *in_RCX;
  WildcardImportSymbol *in_RDX;
  Scope *in_RSI;
  SourceLocation in_RDI;
  string_view sVar5;
  WildcardImportSymbol *import;
  Diagnostic *diag;
  WildcardImportSymbol *import_1;
  iterator __end3;
  iterator __begin3;
  vector<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>
  *__range3;
  vector<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>
  *in_stack_ffffffffffffff38;
  __normal_iterator<const_slang::ast::WildcardImportSymbol_**,_std::vector<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>_>
  symbol;
  SourceLocation in_stack_ffffffffffffff48;
  Token *in_stack_ffffffffffffff50;
  DiagCode noteCode;
  size_t in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  BumpAllocator *this_00;
  size_t in_stack_ffffffffffffff68;
  Scope *scope;
  char *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  __normal_iterator<const_slang::ast::WildcardImportSymbol_**,_std::vector<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>_>
  local_30;
  pointer local_28;
  DiagCode code;
  
  if ((((vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_> *)((long)in_RDI + 0x30))->
      super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>)._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    local_28 = (((vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_> *)
                ((long)in_RDI + 0x30))->
               super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>)._M_impl.
               super__Vector_impl_data._M_start;
    SVar3 = in_RDI;
    local_30._M_current =
         (WildcardImportSymbol **)
         std::
         vector<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>
         ::begin(in_stack_ffffffffffffff38);
    std::
    vector<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>
    ::end(in_stack_ffffffffffffff38);
    while (bVar1 = __gnu_cxx::
                   operator==<const_slang::ast::WildcardImportSymbol_**,_std::vector<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>_>
                             ((__normal_iterator<const_slang::ast::WildcardImportSymbol_**,_std::vector<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>_>
                               *)in_RDI,
                              (__normal_iterator<const_slang::ast::WildcardImportSymbol_**,_std::vector<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>_>
                               *)in_stack_ffffffffffffff38), ((bVar1 ^ 0xffU) & 1) != 0) {
      ppWVar2 = __gnu_cxx::
                __normal_iterator<const_slang::ast::WildcardImportSymbol_**,_std::vector<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>_>
                ::operator*(&local_30);
      pWVar4 = *ppWVar2;
      parsing::Token::valueText(in_stack_ffffffffffffff50);
      __x._M_str = in_stack_ffffffffffffff70;
      __x._M_len = in_stack_ffffffffffffff68;
      __y._M_str = in_stack_ffffffffffffff60;
      __y._M_len = in_stack_ffffffffffffff58;
      bVar1 = std::operator==(__x,__y);
      if (bVar1) {
        bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&pWVar4->packageName);
        noteCode = SUB84((ulong)in_stack_ffffffffffffff50 >> 0x20,0);
        code = SUB84((ulong)in_RDX >> 0x20,0);
        if (bVar1) {
          return;
        }
        parsing::Token::location((Token *)(in_RSI + 1));
        addDiag(in_RSI,code,SVar3);
        Diagnostic::addNote((Diagnostic *)in_RDI,noteCode,in_stack_ffffffffffffff48);
        return;
      }
      __gnu_cxx::
      __normal_iterator<const_slang::ast::WildcardImportSymbol_**,_std::vector<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>_>
      ::operator++(&local_30);
    }
  }
  symbol._M_current = *(WildcardImportSymbol ***)in_RDI;
  sVar5 = parsing::Token::valueText(in_stack_ffffffffffffff50);
  this_00 = (BumpAllocator *)sVar5._M_len;
  scope = (Scope *)sVar5._M_str;
  SVar3 = parsing::Token::location((Token *)(in_RSI + 1));
  pWVar4 = BumpAllocator::
           emplace<slang::ast::WildcardImportSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                     (this_00,(basic_string_view<char,_std::char_traits<char>_> *)SVar3,
                      (SourceLocation *)in_stack_ffffffffffffff50);
  Symbol::setSyntax(&pWVar4->super_Symbol,(SyntaxNode *)in_RSI);
  syntax._M_extent._M_extent_value._0_4_ = in_stack_ffffffffffffff80;
  syntax._M_ptr = (pointer)in_stack_ffffffffffffff78;
  syntax._M_extent._M_extent_value._4_4_ = in_stack_ffffffffffffff84;
  Symbol::setAttributes(&pWVar4->super_Symbol,scope,syntax);
  addMember((Scope *)in_RDI,(Symbol *)symbol._M_current);
  addWildcardImport(in_RCX,in_RDX);
  return;
}

Assistant:

void Scope::addWildcardImport(const PackageImportItemSyntax& item,
                              std::span<const AttributeInstanceSyntax* const> attributes) {
    if (importData) {
        // Check for redundant import statements.
        for (auto import : importData->wildcardImports) {
            if (import->packageName == item.package.valueText()) {
                if (!import->packageName.empty()) {
                    auto& diag = addDiag(diag::DuplicateImport, item.item.location());
                    diag.addNote(diag::NotePreviousDefinition, import->location);
                }
                return;
            }
        }
    }

    auto import = compilation.emplace<WildcardImportSymbol>(item.package.valueText(),
                                                            item.item.location());

    import->setSyntax(item);
    import->setAttributes(*this, attributes);
    addMember(*import);
    addWildcardImport(*import);
}